

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O1

int ncnn::binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_mul>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  uint uVar1;
  undefined1 auVar2 [32];
  ulong uVar3;
  undefined1 (*pauVar4) [64];
  uint uVar5;
  undefined1 (*pauVar6) [64];
  undefined1 (*pauVar7) [64];
  int iVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  
  uVar1 = a->c;
  uVar5 = a->h * a->w * a->d * a->elempack;
  Mat::create_like(c,a,opt->blob_allocator);
  iVar8 = -100;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    if (0 < (int)uVar1) {
      uVar3 = 0;
      do {
        pauVar4 = (undefined1 (*) [64])(a->cstep * uVar3 * a->elemsize + (long)a->data);
        pauVar6 = (undefined1 (*) [64])(b->cstep * uVar3 * b->elemsize + (long)b->data);
        pauVar7 = (undefined1 (*) [64])(c->cstep * uVar3 * c->elemsize + (long)c->data);
        if ((int)uVar5 < 0x10) {
          uVar9 = 0;
        }
        else {
          iVar8 = 0xf;
          do {
            auVar12 = vmulps_avx512f(*pauVar6,*pauVar4);
            *pauVar7 = auVar12;
            pauVar4 = pauVar4 + 1;
            pauVar6 = pauVar6 + 1;
            pauVar7 = pauVar7 + 1;
            iVar8 = iVar8 + 0x10;
            uVar9 = uVar5 & 0xfffffff0;
          } while (iVar8 < (int)uVar5);
        }
        uVar11 = uVar9 | 7;
        while ((int)uVar11 < (int)uVar5) {
          auVar2._4_4_ = *(float *)(*pauVar6 + 4) * *(float *)(*pauVar4 + 4);
          auVar2._0_4_ = *(float *)*pauVar6 * *(float *)*pauVar4;
          auVar2._8_4_ = *(float *)(*pauVar6 + 8) * *(float *)(*pauVar4 + 8);
          auVar2._12_4_ = *(float *)(*pauVar6 + 0xc) * *(float *)(*pauVar4 + 0xc);
          auVar2._16_4_ = *(float *)(*pauVar6 + 0x10) * *(float *)(*pauVar4 + 0x10);
          auVar2._20_4_ = *(float *)(*pauVar6 + 0x14) * *(float *)(*pauVar4 + 0x14);
          auVar2._24_4_ = *(float *)(*pauVar6 + 0x18) * *(float *)(*pauVar4 + 0x18);
          auVar2._28_4_ = *(undefined4 *)(*pauVar6 + 0x1c);
          *(undefined1 (*) [32])*pauVar7 = auVar2;
          pauVar4 = (undefined1 (*) [64])(*pauVar4 + 0x20);
          pauVar6 = (undefined1 (*) [64])(*pauVar6 + 0x20);
          pauVar7 = (undefined1 (*) [64])((long)*pauVar7 + 0x20);
          uVar11 = uVar9 + 0xf;
          uVar9 = uVar9 + 8;
        }
        uVar11 = uVar9 | 3;
        while ((int)uVar11 < (int)uVar5) {
          auVar13._0_4_ = *(float *)*pauVar6 * *(float *)*pauVar4;
          auVar13._4_4_ = *(float *)(*pauVar6 + 4) * *(float *)(*pauVar4 + 4);
          auVar13._8_4_ = *(float *)(*pauVar6 + 8) * *(float *)(*pauVar4 + 8);
          auVar13._12_4_ = *(float *)(*pauVar6 + 0xc) * *(float *)(*pauVar4 + 0xc);
          *(undefined1 (*) [16])*pauVar7 = auVar13;
          pauVar4 = (undefined1 (*) [64])(*pauVar4 + 0x10);
          pauVar6 = (undefined1 (*) [64])(*pauVar6 + 0x10);
          pauVar7 = (undefined1 (*) [64])((long)*pauVar7 + 0x10);
          uVar11 = uVar9 + 7;
          uVar9 = uVar9 + 4;
        }
        if (uVar5 - uVar9 != 0 && (int)uVar9 <= (int)uVar5) {
          lVar10 = 0;
          do {
            *(float *)((long)*pauVar7 + lVar10 * 4) =
                 *(float *)(*pauVar6 + lVar10 * 4) * *(float *)(*pauVar4 + lVar10 * 4);
            lVar10 = lVar10 + 1;
          } while (uVar5 - uVar9 != (int)lVar10);
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 != uVar1);
    }
    iVar8 = 0;
  }
  return iVar8;
}

Assistant:

static int binary_op_7_13_19_29(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    // type 7 13 19 29
    c.create_like(a, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}